

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.c
# Opt level: O3

_Bool upb_MiniTable_Link(upb_MiniTable *m,upb_MiniTable **sub_tables,size_t sub_table_count,
                        upb_MiniTableEnum **sub_enums,size_t sub_enum_count)

{
  byte bVar1;
  upb_MiniTableField *puVar2;
  _Bool _Var3;
  ulong uVar4;
  ulong uVar5;
  size_t sVar6;
  size_t sVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  
  uVar4 = (ulong)m->field_count_dont_copy_me__upb_internal_use_only;
  if (m->field_count_dont_copy_me__upb_internal_use_only == 0) {
    uVar10 = 0;
    sVar6 = 0;
  }
  else {
    lVar11 = 0;
    uVar8 = 0;
    uVar10 = 0;
    do {
      puVar2 = m->fields_dont_copy_me__upb_internal_use_only;
      bVar1 = (&puVar2->descriptortype_dont_copy_me__upb_internal_use_only)[lVar11];
      if (((&puVar2->mode_dont_copy_me__upb_internal_use_only)[lVar11] & 0x10) == 0) {
        if ((ulong)(bVar1 - 1) - 9 < 2) {
          uVar9 = uVar10 + 1;
          if (sub_table_count < uVar9) {
            return false;
          }
          uVar5 = (ulong)uVar10;
          uVar10 = uVar9;
          if (sub_tables[uVar5] != (upb_MiniTable *)0x0) {
            _Var3 = upb_MiniTable_SetSubMessage
                              (m,(upb_MiniTableField *)
                                 ((long)&puVar2->number_dont_copy_me__upb_internal_use_only + lVar11
                                 ),sub_tables[uVar5]);
            if (!_Var3) {
              return false;
            }
            uVar4 = (ulong)m->field_count_dont_copy_me__upb_internal_use_only;
          }
        }
      }
      else if ((bVar1 != 5) && (bVar1 != 0xc)) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mini_table/internal/field.h"
                      ,0x7b,
                      "upb_FieldType upb_MiniTableField_Type(const struct upb_MiniTableField *)");
      }
      uVar8 = uVar8 + 1;
      lVar11 = lVar11 + 0xc;
    } while (uVar8 < uVar4);
    sVar6 = 0;
    if ((short)uVar4 != 0) {
      lVar11 = 0;
      uVar8 = 0;
      sVar7 = sVar6;
      do {
        sVar6 = sVar7;
        if ((&m->fields_dont_copy_me__upb_internal_use_only->
              descriptortype_dont_copy_me__upb_internal_use_only)[lVar11] == '\x0e') {
          sVar6 = (size_t)((int)sVar7 + 1);
          if (sub_enum_count < sVar6) {
            return false;
          }
          if (sub_enums[sVar7] != (upb_MiniTableEnum *)0x0) {
            _Var3 = upb_MiniTable_SetSubEnum
                              (m,(upb_MiniTableField *)
                                 ((long)&m->fields_dont_copy_me__upb_internal_use_only->
                                         number_dont_copy_me__upb_internal_use_only + lVar11),
                               sub_enums[sVar7]);
            if (!_Var3) {
              return false;
            }
            uVar4 = (ulong)m->field_count_dont_copy_me__upb_internal_use_only;
          }
        }
        uVar8 = uVar8 + 1;
        lVar11 = lVar11 + 0xc;
        sVar7 = sVar6;
      } while (uVar8 < uVar4);
    }
  }
  return sVar6 == sub_enum_count && uVar10 == sub_table_count;
}

Assistant:

bool upb_MiniTable_Link(upb_MiniTable* m, const upb_MiniTable** sub_tables,
                        size_t sub_table_count,
                        const upb_MiniTableEnum** sub_enums,
                        size_t sub_enum_count) {
  uint32_t msg_count = 0;
  uint32_t enum_count = 0;

  for (int i = 0; i < upb_MiniTable_FieldCount(m); i++) {
    upb_MiniTableField* f =
        (upb_MiniTableField*)upb_MiniTable_GetFieldByIndex(m, i);
    if (upb_MiniTableField_CType(f) == kUpb_CType_Message) {
      const upb_MiniTable* sub = sub_tables[msg_count++];
      if (msg_count > sub_table_count) return false;
      if (sub && !upb_MiniTable_SetSubMessage(m, f, sub)) return false;
    }
  }

  for (int i = 0; i < upb_MiniTable_FieldCount(m); i++) {
    upb_MiniTableField* f =
        (upb_MiniTableField*)upb_MiniTable_GetFieldByIndex(m, i);
    if (upb_MiniTableField_IsClosedEnum(f)) {
      const upb_MiniTableEnum* sub = sub_enums[enum_count++];
      if (enum_count > sub_enum_count) return false;
      if (sub && !upb_MiniTable_SetSubEnum(m, f, sub)) return false;
    }
  }

  return (msg_count == sub_table_count) && (enum_count == sub_enum_count);
}